

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlineBlocks.cpp
# Opt level: O0

void inlineBlocks(Module *module,Program *program)

{
  Program *pPVar1;
  bool bVar2;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  iVar3;
  Expr **expr;
  iterator __end3;
  iterator __begin3;
  vector<Expr_*,_std::allocator<Expr_*>_> *__range3;
  InliningVisitor iv;
  Block *myBlock;
  BasicBlock *block;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  Func *function;
  Function *func;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *__range1;
  Program *in_stack_ffffffffffffff48;
  InliningVisitor *in_stack_ffffffffffffff50;
  PassType in_stack_ffffffffffffff5c;
  Program *in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff70;
  Program *in_stack_ffffffffffffff78;
  undefined1 local_80 [16];
  Block *local_70;
  reference local_68;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_60;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_58;
  reference local_50;
  Func *local_48;
  reference local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_38;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_30;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *this;
  
  iVar3 = llvm::Module::functions((Module *)in_stack_ffffffffffffff60);
  this = (iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
          *)&stack0xffffffffffffffd8;
  local_30 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::begin(this);
  local_38 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::end(this);
  while( true ) {
    bVar2 = llvm::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    local_40 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x291769);
    local_48 = Program::getFunction
                         (in_stack_ffffffffffffff78,(Function *)in_stack_ffffffffffffff70._M_current
                         );
    local_50 = local_40;
    local_58.NodePtr = (node_pointer)llvm::Function::begin((Function *)in_stack_ffffffffffffff48);
    local_60.NodePtr = (node_pointer)llvm::Function::end((Function *)in_stack_ffffffffffffff48);
    while( true ) {
      bVar2 = llvm::operator!=(&local_58,&local_60);
      if (!bVar2) break;
      local_68 = llvm::
                 ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                 ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                              *)0x2917cf);
      local_70 = Func::createBlockIfNotExist
                           ((Func *)iVar3.end_iterator.NodePtr.NodePtr,
                            (BasicBlock *)iVar3.begin_iterator.NodePtr.NodePtr);
      InliningVisitor::InliningVisitor(in_stack_ffffffffffffff50,(Block *)in_stack_ffffffffffffff48)
      ;
      in_stack_ffffffffffffff78 = (Program *)&local_70->expressions;
      in_stack_ffffffffffffff70 =
           std::vector<Expr_*,_std::allocator<Expr_*>_>::begin
                     ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffff48);
      std::vector<Expr_*,_std::allocator<Expr_*>_>::end
                ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffff48);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                            *)in_stack_ffffffffffffff50,
                           (__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                            *)in_stack_ffffffffffffff48);
        if (!bVar2) break;
        in_stack_ffffffffffffff60 =
             (Program *)
             __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
             operator*((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *)
                       &stack0xffffffffffffff70);
        pPVar1 = (in_stack_ffffffffffffff60->typeHandler).program;
        (**(code **)&(((pPVar1->typeHandler).program)->typeHandler).typeDefs.NumEntries)
                  (pPVar1,local_80);
        in_stack_ffffffffffffff48 =
             (Program *)
             InliningVisitor::simplify
                       ((InliningVisitor *)this,(Expr *)iVar3.end_iterator.NodePtr.NodePtr);
        (in_stack_ffffffffffffff60->typeHandler).program = in_stack_ffffffffffffff48;
        __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
        operator++((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *)
                   &stack0xffffffffffffff70);
      }
      InliningVisitor::~InliningVisitor((InliningVisitor *)0x2918b3);
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                    *)in_stack_ffffffffffffff50);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)in_stack_ffffffffffffff50);
  }
  Program::addPass(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  return;
}

Assistant:

void inlineBlocks(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::IdentifyInlinableBlocks));


    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->createBlockIfNotExist(&block);
            InliningVisitor iv(myBlock);

            for (auto& expr : myBlock->expressions) {
                expr->accept(iv);
                expr = iv.simplify(expr);
            }
        }
    }

    program.addPass(PassType::InlineBlocks);
}